

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O0

int __thiscall
Random_keys::avancaGeracaoesAdaptativo2
          (Random_keys *this,Graph *g,int it_s_melhora,float maxMutacao,float max_pct,
          float taxaTamMut,float taxaPctMut)

{
  int iVar1;
  RK_Individual *pRVar2;
  RK_Individual *pai2_00;
  int iVar3;
  int iVar4;
  reference ppRVar5;
  size_type sVar6;
  uint *puVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  ulong local_b8;
  unsigned_long i_2;
  int i_1;
  int pai2;
  int aux;
  int cand3;
  int cand2;
  int cand1;
  int pai1;
  int i;
  int num_melhores;
  int num_piores;
  RK_Individual *best_1;
  double dStack_78;
  int k;
  double perda;
  RK_Individual *local_60;
  RK_Individual *best;
  float local_50;
  int melhorGeracao;
  float pctMutacao;
  float tamMutacao;
  vector<int,_std::allocator<int>_> chamadaGeracao;
  int it;
  float taxaPctMut_local;
  float taxaTamMut_local;
  float max_pct_local;
  float maxMutacao_local;
  int it_s_melhora_local;
  Graph *g_local;
  Random_keys *this_local;
  
  chamadaGeracao.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  chamadaGeracao.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = taxaPctMut;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&pctMutacao);
  melhorGeracao = 0x3d4ccccd;
  local_50 = 0.1;
  best._4_4_ = 0;
  ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                      (&this->popAtual,(long)(this->tamPop + -1));
  local_60 = *ppRVar5;
  ordenaPopulacaoAtual(this,g);
  dStack_78 = RK_Individual::getActiveLoss(local_60);
  dStack_78 = dStack_78 * 100000.0;
  for (best_1._4_4_ = 0; best_1._4_4_ < this->numGeracoes; best_1._4_4_ = best_1._4_4_ + 1) {
    ordenaPopulacaoAtual(this,g);
    ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                        (&this->popAtual,(long)(this->tamPop + -1));
    pRVar2 = *ppRVar5;
    dVar9 = RK_Individual::getActiveLoss(pRVar2);
    if (dStack_78 <= dVar9 * 100000.0) {
      chamadaGeracao.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           (int)chamadaGeracao.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 1;
    }
    else {
      dStack_78 = RK_Individual::getActiveLoss(pRVar2);
      dStack_78 = dStack_78 * 100000.0;
      best._4_4_ = best_1._4_4_;
      chamadaGeracao.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 0;
    }
    if ((int)chamadaGeracao.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage == it_s_melhora) {
      if ((float)melhorGeracao < maxMutacao) {
        melhorGeracao = (int)(taxaTamMut * (float)melhorGeracao);
      }
      if (local_50 < max_pct) {
        local_50 = chamadaGeracao.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ * local_50;
      }
      if ((local_50 < max_pct) || ((float)melhorGeracao < maxMutacao)) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&pctMutacao,
                   (value_type_conflict1 *)((long)&best_1 + 4));
      }
      chamadaGeracao.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 0;
    }
    std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::operator=
              (&this->popAnterior,&this->popAtual);
    iVar1 = this->tamPop;
    iVar8 = (int)((double)this->tamPop * 0.05);
    for (cand1 = iVar8; cand1 < this->tamPop - (int)((double)iVar1 * 0.1); cand1 = cand1 + 1) {
      rand();
      iVar3 = rand();
      iVar3 = iVar3 % this->tamPop;
      iVar4 = rand();
      aux = iVar4 % this->tamPop;
      iVar4 = rand();
      pai2 = iVar4 % this->tamPop;
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (&this->popAnterior,(long)iVar3);
      dVar9 = RK_Individual::getActiveLoss(*ppRVar5);
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (&this->popAnterior,(long)aux);
      dVar10 = RK_Individual::getActiveLoss(*ppRVar5);
      if (dVar9 < dVar10) {
        aux = iVar3;
      }
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (&this->popAnterior,(long)aux);
      dVar9 = RK_Individual::getActiveLoss(*ppRVar5);
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (&this->popAnterior,(long)pai2);
      dVar10 = RK_Individual::getActiveLoss(*ppRVar5);
      if (dVar9 < dVar10) {
        pai2 = aux;
      }
      i_2._4_4_ = pai2;
      while (i_2._4_4_ == pai2) {
        iVar3 = rand();
        i_2._4_4_ = iVar3 % this->tamPop;
      }
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (&this->popAnterior,(long)pai2);
      pRVar2 = *ppRVar5;
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (&this->popAnterior,(long)i_2._4_4_);
      pai2_00 = *ppRVar5;
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (&this->popAtual,(long)cand1);
      cruzamento2(this,pRVar2,pai2_00,*ppRVar5);
      if (cand1 == iVar8 * 5 || SBORROW4(cand1,iVar8 * 5) != cand1 + iVar8 * -5 < 0) {
        ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                            (&this->popAtual,(long)cand1);
        mutacaoAdaptavitva(this,*ppRVar5,(float)melhorGeracao,local_50);
      }
      else {
        ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                            (&this->popAtual,(long)cand1);
        mutacao(this,*ppRVar5);
      }
    }
    for (i_2._0_4_ = 0; (int)i_2 < iVar8; i_2._0_4_ = (int)i_2 + 1) {
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (&this->popAtual,(long)(int)i_2);
      RK_Individual::generate_random_weights(*ppRVar5);
    }
  }
  ordenaPopulacaoAtual(this,g);
  for (local_b8 = 0;
      sVar6 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&pctMutacao), iVar1 = best._4_4_,
      local_b8 < sVar6; local_b8 = local_b8 + 1) {
    puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::at
                               ((vector<int,_std::allocator<int>_> *)&pctMutacao,local_b8);
    printf("%d,",(ulong)*puVar7);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&pctMutacao);
  return iVar1;
}

Assistant:

int
Random_keys::avancaGeracaoesAdaptativo2(Graph *g, int it_s_melhora, float maxMutacao, float max_pct, float taxaTamMut,
                                        float taxaPctMut) {

    int it=0;
    vector<int> chamadaGeracao;

    ///parametros da mutacao adaptativa
    float tamMutacao = 0.05;
    float pctMutacao = 0.1;
    ///--------------------------------

    int melhorGeracao = 0;
    RK_Individual *best = popAtual.at(this->tamPop - 1);
    this->ordenaPopulacaoAtual(g);
    double perda = 100*1000*best->getActiveLoss();
    for(int k=0; k<this->numGeracoes; k++){

        /** calcula a funcao criterio para cada individuo
         e ordena a populacao da maior perda(pior individuo)
         pra menor perda(melhor individuo), perdaAtiva**/
        this->ordenaPopulacaoAtual(g);

        RK_Individual *best = popAtual.at(this->tamPop - 1);
        if (100*1000*best->getActiveLoss() < perda){
            perda = 100*1000*best->getActiveLoss();
//            printf("\ngeracao (%d)  melhor individuo: %lf kw", k, 100*1000*best->getPerdaAtiva());//resultado ja em kw
            melhorGeracao = k;
            it=0;
        }else{
            it++;
        }

        if(it==it_s_melhora){
            if(tamMutacao<maxMutacao)
                tamMutacao*=taxaTamMut;
            if(pctMutacao<max_pct)
                pctMutacao*=taxaPctMut;
            if(pctMutacao<max_pct || tamMutacao<maxMutacao){
                chamadaGeracao.push_back(k);
//                printf("(%f, %f)", tamMutacao, pctMutacao);
            }
            it=0;
        }

        popAnterior = popAtual;

        int num_piores = 0.05*this->tamPop;
        int num_melhores = 0.1*this->tamPop;

        for(int i=num_piores; i<this->tamPop-num_melhores; i++){

            /** cruzamento entre pai1 e pai2 entre os
            individuos aleatorios da populacao anterior
            modificar por uma escolha em roleta no futuro**/
            int pai1 = rand() % this->tamPop;
//            int pai2 = rand() % this->tamPop; //aleatorio

            /*torneio com 3*/
            int cand1, cand2, cand3;
            cand1 = rand() % this->tamPop;
            cand2 = rand() % this->tamPop;
            cand3 = rand() % this->tamPop;

            int aux = cand1;

            if(popAnterior.at(cand1)->getActiveLoss() < popAnterior.at(cand2)->getActiveLoss()){
                cand2=cand1;
            }else{aux = cand2;}
            if(popAnterior.at(cand2)->getActiveLoss() < popAnterior.at(cand3)->getActiveLoss()){
                cand3=cand2;
            }else{aux = cand3;}
            pai1 = aux;

            int pai2 = cand3;

            while(pai2==pai1)
                pai2 = rand() % this->tamPop;

//            popAnterior.at(pai1)->cruzamentoMedia2(popAnterior.at(pai2), popAtual.at(i));
            this->cruzamento2(popAnterior.at(pai1), popAnterior.at(pai2), popAtual.at(i));
//            popAtual.at(i)->mutacao();

            if(i<=5*num_piores)
                this->mutacaoAdaptavitva(popAtual.at(i), tamMutacao, pctMutacao);
            else
                this->mutacao(popAtual.at(i));
        }

        /**aleatorio ao inves de manter piores**/
        for(int i=0; i<num_piores; i++)
            popAtual.at(i)->generate_random_weights();
    }

//    cout << "\n--------------------------------------"<<endl;
//    for(unsigned int i=0; i<popAtual.size(); i++)
//        cout << 100*1000*popAtual.at(i)->getPerdaAtiva() << " , ";
//    cout << "\n--------------------------------------"<<endl;

    this->ordenaPopulacaoAtual(g);

    for(unsigned long int i=0; i<chamadaGeracao.size();i++)
        printf("%d,", chamadaGeracao.at(i));

    return melhorGeracao;
}